

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_triag_mesh_builder.cc
# Opt level: O0

shared_ptr<lf::mesh::Mesh> __thiscall
lf::mesh::utils::TPTriagMeshBuilder::Build(TPTriagMeshBuilder *this)

{
  allocator<unsigned_int> *paVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  source_loc loc_02;
  source_loc loc_03;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  format_string_t<int_&,_const_unsigned_int_&,_const_unsigned_int_&> fmt;
  initializer_list<unsigned_int> __l_02;
  format_string_t<int_&,_const_unsigned_int_&,_const_unsigned_int_&> fmt_00;
  initializer_list<unsigned_int> __l_03;
  format_string_t<int_&,_unsigned_int_&,_unsigned_int_&> fmt_01;
  format_string_t<int_&,_Eigen::Transpose<Eigen::Matrix<double,_2,_1>_>_> fmt_02;
  format_string_t<const_unsigned_int_&,_const_unsigned_int_&,_const_unsigned_int_&> fmt_03;
  value_type vVar5;
  size_type sVar6;
  __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var7;
  element_type *peVar8;
  Scalar *pSVar9;
  ulong uVar10;
  pointer pMVar11;
  reference pvVar12;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *pCVar13;
  CommaInitializer<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *pCVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  TPTriagMeshBuilder *in_RSI;
  shared_ptr<lf::mesh::Mesh> sVar16;
  undefined1 local_5f0 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_5e8;
  span<const_unsigned_int,_18446744073709551615UL> local_5e0;
  RefElType local_5c9;
  __single_object tria_geo_low_ptr;
  double local_5b8;
  double local_5b0;
  double local_5a8;
  double local_5a0;
  double local_598;
  CommaInitializer<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> local_590;
  int local_570 [2];
  undefined1 local_568 [8];
  Matrix<double,__1,_3,_0,__1,_3> tria_geo_low;
  undefined1 local_538 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertex_index_list_low;
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_518;
  span<const_unsigned_int,_18446744073709551615UL> local_510;
  RefElType local_4f9;
  double local_4f8;
  double local_4f0;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0;
  CommaInitializer<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> local_4c8;
  int local_4a8 [2];
  undefined1 local_4a0 [8];
  Matrix<double,__1,_3,_0,__1,_3> tria_geo_up;
  undefined1 local_470 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertex_index_list_up;
  size_type j_4;
  size_type i_4;
  size_type tria_cnt;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t_idx;
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_428;
  span<const_unsigned_int,_18446744073709551615UL> local_420;
  RefElType local_409;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> local_3e8;
  int local_3c8 [2];
  undefined1 local_3c0 [8];
  Matrix<double,__1,_2,_0,__1,_2> edge_geo_2;
  value_type local_3a8;
  value_type local_3a4;
  iterator local_3a0;
  size_type local_398;
  undefined1 local_390 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> nodes_index_list_2;
  source_loc local_368;
  value_type local_350;
  value_type local_34c;
  size_type second_endpoint_idx_2;
  size_type first_endpoint_idx_2;
  size_type j_3;
  size_type i_3;
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_338;
  span<const_unsigned_int,_18446744073709551615UL> local_330;
  RefElType local_319;
  double local_318;
  double local_310;
  double local_308;
  double local_300;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> local_2f8;
  int local_2d8 [2];
  undefined1 local_2d0 [8];
  Matrix<double,__1,_2,_0,__1,_2> edge_geo_1;
  value_type local_2b8;
  value_type local_2b4;
  iterator local_2b0;
  size_type local_2a8;
  undefined1 local_2a0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> nodes_index_list_1;
  source_loc local_278;
  value_type local_260;
  value_type local_25c;
  size_type second_endpoint_idx_1;
  size_type first_endpoint_idx_1;
  size_type j_2;
  size_type i_2;
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_248;
  span<const_unsigned_int,_18446744073709551615UL> local_240;
  RefElType local_229;
  double local_228;
  double local_220;
  double local_218;
  double local_210;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> local_208;
  int local_1e8 [2];
  undefined1 local_1e0 [8];
  Matrix<double,__1,_2,_0,__1,_2> edge_geo;
  value_type local_1c8;
  value_type local_1c4;
  iterator local_1c0;
  size_type local_1b8;
  undefined1 local_1b0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> nodes_index_list;
  source_loc local_188;
  value_type local_170;
  value_type local_16c;
  value_type second_endpoint_idx;
  value_type first_endpoint_idx;
  size_type j_1;
  size_type i_1;
  int edge_cnt;
  vector<unsigned_int,_std::allocator<unsigned_int>_> e_idx;
  Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_130;
  char *local_128;
  size_t local_120;
  source_loc local_118;
  double local_100;
  double local_f8;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_f0;
  int local_cc;
  undefined1 local_c8 [8];
  coord_t node_coord;
  uint local_b0;
  uint local_ac;
  size_type i;
  size_type j;
  int node_cnt;
  allocator<unsigned_int> local_91;
  undefined1 local_90 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> v_idx;
  double hy;
  double hx;
  double y_size;
  double x_size;
  source_loc local_48;
  uint local_2c;
  uint local_28;
  uint no_of_vertices;
  uint no_of_edges;
  uint no_of_cells;
  size_type ny;
  size_type nx;
  TPTriagMeshBuilder *this_local;
  
  no_of_cells = (in_RSI->super_StructuredMeshBuilder).num_of_x_cells_;
  no_of_edges = (in_RSI->super_StructuredMeshBuilder).num_of_y_cells_;
  no_of_vertices = no_of_cells * no_of_edges * 2;
  local_28 = no_of_cells * no_of_edges + (no_of_cells + 1) * no_of_edges +
             no_of_cells * (no_of_edges + 1);
  local_2c = (no_of_cells + 1) * (no_of_edges + 1);
  this_local = this;
  p_Var7 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)Logger()
  ;
  peVar8 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var7);
  spdlog::source_loc::source_loc
            (&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_triag_mesh_builder.cc"
             ,0x1d,"Build");
  fmt_03.str_.size_ = 0x27;
  fmt_03.str_.data_ = "TPmesh: {} cells, {} edges, {} vertices";
  loc.line = local_48.line;
  loc._12_4_ = local_48._12_4_;
  loc.filename = local_48.filename;
  loc.funcname = local_48.funcname;
  spdlog::logger::log<unsigned_int_const&,unsigned_int_const&,unsigned_int_const&>
            (peVar8,loc,debug,fmt_03,&no_of_vertices,&local_28,&local_2c);
  if (no_of_vertices == 0) {
    std::shared_ptr<lf::mesh::Mesh>::shared_ptr((shared_ptr<lf::mesh::Mesh> *)this,(nullptr_t)0x0);
    _Var15._M_pi = extraout_RDX;
  }
  else {
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                        &(in_RSI->super_StructuredMeshBuilder).top_right_corner_,0);
    dVar2 = *pSVar9;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                        &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
    dVar3 = *pSVar9;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                        &(in_RSI->super_StructuredMeshBuilder).top_right_corner_,1);
    dVar4 = *pSVar9;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                        &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
    if ((dVar2 - dVar3 <= 0.0) || (dVar4 - *pSVar9 <= 0.0)) {
      std::shared_ptr<lf::mesh::Mesh>::shared_ptr((shared_ptr<lf::mesh::Mesh> *)this,(nullptr_t)0x0)
      ;
      _Var15._M_pi = extraout_RDX_00;
    }
    else {
      dVar2 = (dVar2 - dVar3) / (double)no_of_cells;
      v_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)((dVar4 - *pSVar9) / (double)no_of_edges)
      ;
      uVar10 = (ulong)local_2c;
      std::allocator<unsigned_int>::allocator(&local_91);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,uVar10,&local_91);
      std::allocator<unsigned_int>::~allocator(&local_91);
      i = 0;
      for (local_ac = 0; local_ac <= no_of_edges; local_ac = local_ac + 1) {
        for (local_b0 = 0; local_b0 <= no_of_cells; local_b0 = local_b0 + 1) {
          local_cc = 2;
          Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix<int>
                    ((Matrix<double,_2,_1,_0,_2,_1> *)local_c8,&local_cc);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_f8 = (double)local_b0 * dVar2 + *pSVar9;
          Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<
                    (&local_f0,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_c8,
                     &local_f8);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_100 = (double)local_ac *
                      (double)v_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + *pSVar9;
          Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
                    (&local_f0,&local_100);
          Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer
                    (&local_f0);
          p_Var7 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   Logger();
          peVar8 = std::
                   __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var7);
          spdlog::source_loc::source_loc
                    (&local_118,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_triag_mesh_builder.cc"
                     ,0x38,"Build");
          local_128 = "Adding vertex {}: {}";
          local_120 = 0x14;
          local_130.m_matrix =
               (non_const_type)
               Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_c8);
          fmt_02.str_.size_ = local_120;
          fmt_02.str_.data_ = local_128;
          loc_00.line = local_118.line;
          loc_00._12_4_ = local_118._12_4_;
          loc_00.filename = local_118.filename;
          loc_00.funcname = local_118.funcname;
          spdlog::logger::log<int&,Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>>>
                    (peVar8,loc_00,trace,fmt_02,(int *)&i,&local_130);
          pMVar11 = std::
                    unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
                    operator->(&(in_RSI->super_StructuredMeshBuilder).mesh_factory_);
          Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
                    ((Matrix<double,_1,1,0,_1,1> *)
                     &e_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_c8);
          vVar5 = (*pMVar11->_vptr_MeshFactory[2])
                            (pMVar11,&e_idx.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                               (long)(int)i);
          *pvVar12 = vVar5;
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                    ((Matrix<double,__1,_1,_0,__1,_1> *)
                     &e_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          i = i + 1;
        }
      }
      uVar10 = (ulong)local_28;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i_1 + 3));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&edge_cnt,uVar10,
                 (allocator<unsigned_int> *)((long)&i_1 + 3));
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i_1 + 3));
      j_1 = 0;
      for (first_endpoint_idx = 0; first_endpoint_idx < no_of_cells;
          first_endpoint_idx = first_endpoint_idx + 1) {
        for (second_endpoint_idx = 0; second_endpoint_idx <= no_of_edges;
            second_endpoint_idx = second_endpoint_idx + 1) {
          sVar6 = VertexIndex(in_RSI,first_endpoint_idx,second_endpoint_idx);
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                               (ulong)sVar6);
          local_16c = *pvVar12;
          sVar6 = VertexIndex(in_RSI,first_endpoint_idx + 1,second_endpoint_idx);
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                               (ulong)sVar6);
          local_170 = *pvVar12;
          p_Var7 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   Logger();
          peVar8 = std::
                   __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var7);
          spdlog::source_loc::source_loc
                    (&local_188,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_triag_mesh_builder.cc"
                     ,0x4b,"Build");
          nodes_index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_77b98b;
          fmt_01.str_.size_ = 0x1d;
          fmt_01.str_.data_ = "horizontal edge {}: {} <-> {}";
          loc_01.line = local_188.line;
          loc_01._12_4_ = local_188._12_4_;
          loc_01.filename = local_188.filename;
          loc_01.funcname = local_188.funcname;
          spdlog::logger::log<int&,unsigned_int&,unsigned_int&>
                    (peVar8,loc_01,trace,fmt_01,(int *)&j_1,&local_16c,&local_170);
          local_1c8 = local_16c;
          local_1c4 = local_170;
          local_1c0 = &local_1c8;
          local_1b8 = 2;
          paVar1 = (allocator<unsigned_int> *)
                   ((long)&edge_geo.super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.
                           m_storage.m_rows + 7);
          std::allocator<unsigned_int>::allocator(paVar1);
          __l_03._M_len = local_1b8;
          __l_03._M_array = local_1c0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b0,__l_03,paVar1)
          ;
          std::allocator<unsigned_int>::~allocator
                    ((allocator<unsigned_int> *)
                     ((long)&edge_geo.super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>
                             .m_storage.m_rows + 7));
          local_1e8[1] = 2;
          local_1e8[0] = 2;
          Eigen::Matrix<double,-1,2,0,-1,2>::Matrix<int,int>
                    ((Matrix<double,_1,2,0,_1,2> *)local_1e0,local_1e8 + 1,local_1e8);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_210 = (double)first_endpoint_idx * dVar2 + *pSVar9;
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator<<
                    (&local_208,(DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)local_1e0,
                     &local_210);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_218 = (double)(first_endpoint_idx + 1) * dVar2 + *pSVar9;
          pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                              (&local_208,&local_218);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_220 = (double)second_endpoint_idx *
                      (double)v_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + *pSVar9;
          pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                              (pCVar13,&local_220);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_228 = (double)second_endpoint_idx *
                      (double)v_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + *pSVar9;
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                    (pCVar13,&local_228);
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::~CommaInitializer
                    (&local_208);
          pMVar11 = std::
                    unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
                    operator->(&(in_RSI->super_StructuredMeshBuilder).mesh_factory_);
          local_229 = (RefElType)lf::base::RefEl::kSegment();
          std::span<const_unsigned_int,_18446744073709551615UL>::
          span<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
                    (&local_240,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b0);
          std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,2,0,_1,2>&>
                    ((Matrix<double,__1,_2,_0,__1,_2> *)&j_2);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          unique_ptr<lf::geometry::SegmentO1,std::default_delete<lf::geometry::SegmentO1>,void>
                    ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                      *)&local_248,
                     (unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                      *)&j_2);
          vVar5 = (*pMVar11->_vptr_MeshFactory[4])
                            (pMVar11,(ulong)local_229,&local_240,
                             (unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                              *)&local_248);
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&edge_cnt,
                               (long)(int)j_1);
          *pvVar12 = vVar5;
          std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
          ~unique_ptr(&local_248);
          std::unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>::
          ~unique_ptr((unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                       *)&j_2);
          Eigen::Matrix<double,_-1,_2,_0,_-1,_2>::~Matrix
                    ((Matrix<double,__1,_2,_0,__1,_2> *)local_1e0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b0);
          j_1 = j_1 + 1;
        }
      }
      for (first_endpoint_idx_1 = 0; first_endpoint_idx_1 <= no_of_cells;
          first_endpoint_idx_1 = first_endpoint_idx_1 + 1) {
        for (second_endpoint_idx_1 = 0; second_endpoint_idx_1 < no_of_edges;
            second_endpoint_idx_1 = second_endpoint_idx_1 + 1) {
          sVar6 = VertexIndex(in_RSI,first_endpoint_idx_1,second_endpoint_idx_1);
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                               (ulong)sVar6);
          local_25c = *pvVar12;
          sVar6 = VertexIndex(in_RSI,first_endpoint_idx_1,second_endpoint_idx_1 + 1);
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                               (ulong)sVar6);
          local_260 = *pvVar12;
          p_Var7 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   Logger();
          peVar8 = std::
                   __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var7);
          spdlog::source_loc::source_loc
                    (&local_278,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_triag_mesh_builder.cc"
                     ,0x61,"Build");
          nodes_index_list_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_77b9a4;
          fmt_00.str_.size_ = 0x1b;
          fmt_00.str_.data_ = "vertical edge {}: {} <-> {}";
          loc_02.line = local_278.line;
          loc_02._12_4_ = local_278._12_4_;
          loc_02.filename = local_278.filename;
          loc_02.funcname = local_278.funcname;
          spdlog::logger::log<int&,unsigned_int_const&,unsigned_int_const&>
                    (peVar8,loc_02,trace,fmt_00,(int *)&j_1,&local_25c,&local_260);
          local_2b8 = local_25c;
          local_2b4 = local_260;
          local_2b0 = &local_2b8;
          local_2a8 = 2;
          paVar1 = (allocator<unsigned_int> *)
                   ((long)&edge_geo_1.super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>
                           .m_storage.m_rows + 7);
          std::allocator<unsigned_int>::allocator(paVar1);
          __l_02._M_len = local_2a8;
          __l_02._M_array = local_2b0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0,__l_02,paVar1)
          ;
          std::allocator<unsigned_int>::~allocator
                    ((allocator<unsigned_int> *)
                     ((long)&edge_geo_1.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.
                             m_storage.m_rows + 7));
          local_2d8[1] = 2;
          local_2d8[0] = 2;
          Eigen::Matrix<double,-1,2,0,-1,2>::Matrix<int,int>
                    ((Matrix<double,_1,2,0,_1,2> *)local_2d0,local_2d8 + 1,local_2d8);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_300 = (double)first_endpoint_idx_1 * dVar2 + *pSVar9;
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator<<
                    (&local_2f8,(DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)local_2d0,
                     &local_300);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_308 = (double)first_endpoint_idx_1 * dVar2 + *pSVar9;
          pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                              (&local_2f8,&local_308);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_310 = (double)second_endpoint_idx_1 *
                      (double)v_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + *pSVar9;
          pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                              (pCVar13,&local_310);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_318 = (double)(second_endpoint_idx_1 + 1) *
                      (double)v_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + *pSVar9;
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                    (pCVar13,&local_318);
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::~CommaInitializer
                    (&local_2f8);
          pMVar11 = std::
                    unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
                    operator->(&(in_RSI->super_StructuredMeshBuilder).mesh_factory_);
          local_319 = (RefElType)lf::base::RefEl::kSegment();
          std::span<const_unsigned_int,_18446744073709551615UL>::
          span<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
                    (&local_330,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0);
          std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,2,0,_1,2>&>
                    ((Matrix<double,__1,_2,_0,__1,_2> *)&j_3);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          unique_ptr<lf::geometry::SegmentO1,std::default_delete<lf::geometry::SegmentO1>,void>
                    ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                      *)&local_338,
                     (unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                      *)&j_3);
          vVar5 = (*pMVar11->_vptr_MeshFactory[4])
                            (pMVar11,(ulong)local_319,&local_330,
                             (unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                              *)&local_338);
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&edge_cnt,
                               (long)(int)j_1);
          *pvVar12 = vVar5;
          std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
          ~unique_ptr(&local_338);
          std::unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>::
          ~unique_ptr((unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                       *)&j_3);
          Eigen::Matrix<double,_-1,_2,_0,_-1,_2>::~Matrix
                    ((Matrix<double,__1,_2,_0,__1,_2> *)local_2d0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0);
          j_1 = j_1 + 1;
        }
      }
      for (first_endpoint_idx_2 = 0; first_endpoint_idx_2 < no_of_cells;
          first_endpoint_idx_2 = first_endpoint_idx_2 + 1) {
        for (second_endpoint_idx_2 = 0; second_endpoint_idx_2 < no_of_edges;
            second_endpoint_idx_2 = second_endpoint_idx_2 + 1) {
          sVar6 = VertexIndex(in_RSI,first_endpoint_idx_2,second_endpoint_idx_2);
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                               (ulong)sVar6);
          local_34c = *pvVar12;
          sVar6 = VertexIndex(in_RSI,first_endpoint_idx_2 + 1,second_endpoint_idx_2 + 1);
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                               (ulong)sVar6);
          local_350 = *pvVar12;
          p_Var7 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   Logger();
          peVar8 = std::
                   __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var7);
          spdlog::source_loc::source_loc
                    (&local_368,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_triag_mesh_builder.cc"
                     ,0x77,"Build");
          nodes_index_list_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_77b9bd;
          fmt.str_.size_ = 0x1b;
          fmt.str_.data_ = "diagonal edge {}: {} <-> {}";
          loc_03.line = local_368.line;
          loc_03._12_4_ = local_368._12_4_;
          loc_03.filename = local_368.filename;
          loc_03.funcname = local_368.funcname;
          spdlog::logger::log<int&,unsigned_int_const&,unsigned_int_const&>
                    (peVar8,loc_03,trace,fmt,(int *)&j_1,&local_34c,&local_350);
          local_3a8 = local_34c;
          local_3a4 = local_350;
          local_3a0 = &local_3a8;
          local_398 = 2;
          paVar1 = (allocator<unsigned_int> *)
                   ((long)&edge_geo_2.super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>
                           .m_storage.m_rows + 7);
          std::allocator<unsigned_int>::allocator(paVar1);
          __l_01._M_len = local_398;
          __l_01._M_array = local_3a0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_390,__l_01,paVar1)
          ;
          std::allocator<unsigned_int>::~allocator
                    ((allocator<unsigned_int> *)
                     ((long)&edge_geo_2.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.
                             m_storage.m_rows + 7));
          local_3c8[1] = 2;
          local_3c8[0] = 2;
          Eigen::Matrix<double,-1,2,0,-1,2>::Matrix<int,int>
                    ((Matrix<double,_1,2,0,_1,2> *)local_3c0,local_3c8 + 1,local_3c8);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_3f0 = (double)first_endpoint_idx_2 * dVar2 + *pSVar9;
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator<<
                    (&local_3e8,(DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)local_3c0,
                     &local_3f0);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_3f8 = (double)(first_endpoint_idx_2 + 1) * dVar2 + *pSVar9;
          pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                              (&local_3e8,&local_3f8);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_400 = (double)second_endpoint_idx_2 *
                      (double)v_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + *pSVar9;
          pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                              (pCVar13,&local_400);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_408 = (double)(second_endpoint_idx_2 + 1) *
                      (double)v_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + *pSVar9;
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                    (pCVar13,&local_408);
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::~CommaInitializer
                    (&local_3e8);
          pMVar11 = std::
                    unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
                    operator->(&(in_RSI->super_StructuredMeshBuilder).mesh_factory_);
          local_409 = (RefElType)lf::base::RefEl::kSegment();
          std::span<const_unsigned_int,_18446744073709551615UL>::
          span<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
                    (&local_420,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_390);
          std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,2,0,_1,2>&>
                    ((Matrix<double,__1,_2,_0,__1,_2> *)
                     &t_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          unique_ptr<lf::geometry::SegmentO1,std::default_delete<lf::geometry::SegmentO1>,void>
                    ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                      *)&local_428,
                     (unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                      *)&t_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
          vVar5 = (*pMVar11->_vptr_MeshFactory[4])
                            (pMVar11,(ulong)local_409,&local_420,
                             (unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                              *)&local_428);
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&edge_cnt,
                               (long)(int)j_1);
          *pvVar12 = vVar5;
          std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
          ~unique_ptr(&local_428);
          std::unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>::
          ~unique_ptr((unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                       *)&t_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
          Eigen::Matrix<double,_-1,_2,_0,_-1,_2>::~Matrix
                    ((Matrix<double,__1,_2,_0,__1,_2> *)local_3c0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_390);
          j_1 = j_1 + 1;
        }
      }
      uVar10 = (ulong)no_of_vertices;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i_4 + 3));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&tria_cnt,uVar10,
                 (allocator<unsigned_int> *)((long)&i_4 + 3));
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i_4 + 3));
      j_4 = 0;
      for (vertex_index_list_up.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          vertex_index_list_up.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < no_of_cells;
          vertex_index_list_up.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               vertex_index_list_up.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        for (vertex_index_list_up.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            (uint)vertex_index_list_up.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage < no_of_edges;
            vertex_index_list_up.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                 (uint)vertex_index_list_up.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 1) {
          sVar6 = VertexIndex(in_RSI,vertex_index_list_up.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              (uint)vertex_index_list_up.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                               (ulong)sVar6);
          tria_geo_up.super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_rows._4_4_ = *pvVar12;
          sVar6 = VertexIndex(in_RSI,vertex_index_list_up.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1,
                              (uint)vertex_index_list_up.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,(ulong)sVar6);
          sVar6 = VertexIndex(in_RSI,vertex_index_list_up.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              (uint)vertex_index_list_up.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,(ulong)sVar6);
          paVar1 = (allocator<unsigned_int> *)
                   ((long)&tria_geo_up.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
                           m_rows + 3);
          std::allocator<unsigned_int>::allocator(paVar1);
          __l_00._M_len = 3;
          __l_00._M_array =
               (iterator)
               ((long)&tria_geo_up.super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
                       m_storage.m_rows + 4);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_470,__l_00,paVar1)
          ;
          std::allocator<unsigned_int>::~allocator
                    ((allocator<unsigned_int> *)
                     ((long)&tria_geo_up.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
                             m_storage.m_rows + 3));
          local_4a8[1] = 2;
          local_4a8[0] = 3;
          Eigen::Matrix<double,-1,3,0,-1,3>::Matrix<int,int>
                    ((Matrix<double,_1,3,0,_1,3> *)local_4a0,local_4a8 + 1,local_4a8);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_4d0 = (double)vertex_index_list_up.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * dVar2 +
                      *pSVar9;
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator<<
                    (&local_4c8,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)local_4a0,
                     &local_4d0);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_4d8 = (double)(vertex_index_list_up.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) * dVar2
                      + *pSVar9;
          pCVar14 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                              (&local_4c8,&local_4d8);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_4e0 = (double)vertex_index_list_up.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * dVar2 +
                      *pSVar9;
          pCVar14 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                              (pCVar14,&local_4e0);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_4e8 = (double)(uint)vertex_index_list_up.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage *
                      (double)v_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + *pSVar9;
          pCVar14 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                              (pCVar14,&local_4e8);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_4f0 = (double)((uint)vertex_index_list_up.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) *
                      (double)v_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + *pSVar9;
          pCVar14 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                              (pCVar14,&local_4f0);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_4f8 = (double)((uint)vertex_index_list_up.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) *
                      (double)v_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + *pSVar9;
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                    (pCVar14,&local_4f8);
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::~CommaInitializer
                    (&local_4c8);
          pMVar11 = std::
                    unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
                    operator->(&(in_RSI->super_StructuredMeshBuilder).mesh_factory_);
          local_4f9 = (RefElType)lf::base::RefEl::kTria();
          std::span<const_unsigned_int,_18446744073709551615UL>::
          span<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
                    (&local_510,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_470);
          std::make_unique<lf::geometry::TriaO1,Eigen::Matrix<double,_1,3,0,_1,3>&>
                    ((Matrix<double,__1,_3,_0,__1,_3> *)
                     &vertex_index_list_low.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          unique_ptr<lf::geometry::TriaO1,std::default_delete<lf::geometry::TriaO1>,void>
                    ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                      *)&local_518,
                     (unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *
                     )&vertex_index_list_low.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
          vVar5 = (*pMVar11->_vptr_MeshFactory[4])
                            (pMVar11,(ulong)local_4f9,&local_510,
                             (unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                              *)&local_518);
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&tria_cnt,
                               (ulong)j_4);
          *pvVar12 = vVar5;
          std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
          ~unique_ptr(&local_518);
          std::unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>::
          ~unique_ptr((unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>
                       *)&vertex_index_list_low.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
          sVar6 = VertexIndex(in_RSI,vertex_index_list_up.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              (uint)vertex_index_list_up.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                               (ulong)sVar6);
          tria_geo_low.super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_rows._4_4_ = *pvVar12;
          sVar6 = VertexIndex(in_RSI,vertex_index_list_up.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1,
                              (uint)vertex_index_list_up.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,(ulong)sVar6);
          sVar6 = VertexIndex(in_RSI,vertex_index_list_up.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1,
                              (uint)vertex_index_list_up.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,(ulong)sVar6);
          paVar1 = (allocator<unsigned_int> *)
                   ((long)&tria_geo_low.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
                           m_rows + 3);
          std::allocator<unsigned_int>::allocator(paVar1);
          __l._M_len = 3;
          __l._M_array = (iterator)
                         ((long)&tria_geo_low.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
                                 m_storage.m_rows + 4);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_538,__l,paVar1);
          std::allocator<unsigned_int>::~allocator
                    ((allocator<unsigned_int> *)
                     ((long)&tria_geo_low.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
                             m_storage.m_rows + 3));
          local_570[1] = 2;
          local_570[0] = 3;
          Eigen::Matrix<double,-1,3,0,-1,3>::Matrix<int,int>
                    ((Matrix<double,_1,3,0,_1,3> *)local_568,local_570 + 1,local_570);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_598 = (double)vertex_index_list_up.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * dVar2 +
                      *pSVar9;
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator<<
                    (&local_590,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)local_568,
                     &local_598);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_5a0 = (double)(vertex_index_list_up.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) * dVar2
                      + *pSVar9;
          pCVar14 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                              (&local_590,&local_5a0);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_5a8 = (double)(vertex_index_list_up.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) * dVar2
                      + *pSVar9;
          pCVar14 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                              (pCVar14,&local_5a8);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_5b0 = (double)(uint)vertex_index_list_up.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage *
                      (double)v_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + *pSVar9;
          pCVar14 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                              (pCVar14,&local_5b0);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_5b8 = (double)(uint)vertex_index_list_up.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage *
                      (double)v_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + *pSVar9;
          pCVar14 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                              (pCVar14,&local_5b8);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          tria_geo_low_ptr._M_t.
          super___uniq_ptr_impl<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>.
          _M_t.
          super__Tuple_impl<0UL,_lf::geometry::TriaO1_*,_std::default_delete<lf::geometry::TriaO1>_>
          .super__Head_base<0UL,_lf::geometry::TriaO1_*,_false>._M_head_impl =
               (__uniq_ptr_data<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>,_true,_true>
                )((double)((uint)vertex_index_list_up.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 1) *
                  (double)v_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + *pSVar9);
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                    (pCVar14,(Scalar *)&tria_geo_low_ptr);
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::~CommaInitializer
                    (&local_590);
          std::make_unique<lf::geometry::TriaO1,Eigen::Matrix<double,_1,3,0,_1,3>&>
                    ((Matrix<double,__1,_3,_0,__1,_3> *)&stack0xfffffffffffffa38);
          pMVar11 = std::
                    unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
                    operator->(&(in_RSI->super_StructuredMeshBuilder).mesh_factory_);
          local_5c9 = (RefElType)lf::base::RefEl::kTria();
          std::span<const_unsigned_int,_18446744073709551615UL>::
          span<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
                    (&local_5e0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_538);
          std::make_unique<lf::geometry::TriaO1,Eigen::Matrix<double,_1,3,0,_1,3>&>
                    ((Matrix<double,__1,_3,_0,__1,_3> *)local_5f0);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          unique_ptr<lf::geometry::TriaO1,std::default_delete<lf::geometry::TriaO1>,void>
                    ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                      *)&local_5e8,
                     (unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *
                     )local_5f0);
          vVar5 = (*pMVar11->_vptr_MeshFactory[4])
                            (pMVar11,(ulong)local_5c9,&local_5e0,
                             (unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                              *)&local_5e8);
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&tria_cnt,
                               (ulong)(j_4 + 1));
          *pvVar12 = vVar5;
          std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
          ~unique_ptr(&local_5e8);
          std::unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>::
          ~unique_ptr((unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>
                       *)local_5f0);
          std::unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>::
          ~unique_ptr((unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>
                       *)&stack0xfffffffffffffa38);
          Eigen::Matrix<double,_-1,_3,_0,_-1,_3>::~Matrix
                    ((Matrix<double,__1,_3,_0,__1,_3> *)local_568);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_538);
          Eigen::Matrix<double,_-1,_3,_0,_-1,_3>::~Matrix
                    ((Matrix<double,__1,_3,_0,__1,_3> *)local_4a0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_470);
          j_4 = j_4 + 2;
        }
      }
      pMVar11 = std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
                ::operator->(&(in_RSI->super_StructuredMeshBuilder).mesh_factory_);
      (*pMVar11->_vptr_MeshFactory[5])(this);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&tria_cnt);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&edge_cnt);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
      _Var15._M_pi = extraout_RDX_01;
    }
  }
  sVar16.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var15._M_pi;
  sVar16.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<lf::mesh::Mesh>)
         sVar16.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<mesh::Mesh> TPTriagMeshBuilder::Build() {
  using coord_t = Eigen::Vector2d;
  const size_type nx = num_of_x_cells_;
  const size_type ny = num_of_y_cells_;
  // Total number of entities in the mesh
  // Each square is split into two triangles
  const unsigned no_of_cells = 2 * nx * ny;
  const unsigned no_of_edges = nx * ny + (nx + 1) * ny + nx * (ny + 1);
  const unsigned no_of_vertices = (nx + 1) * (ny + 1);
  // Diagnostics
  SPDLOG_LOGGER_DEBUG(Logger(), "TPmesh: {} cells, {} edges, {} vertices",
                      no_of_cells, no_of_edges, no_of_vertices);

  // No mesh to build
  if (no_of_cells == 0) {
    return nullptr;
  }
  // define rectangle; return if none
  const double x_size = top_right_corner_[0] - bottom_left_corner_[0];
  const double y_size = top_right_corner_[1] - bottom_left_corner_[1];
  if ((x_size <= 0.0) || (y_size <= 0.0)) {
    return nullptr;
  }
  // meshwidths
  const double hx = x_size / nx;
  const double hy = y_size / ny;

  // Initialize vertices
  std::vector<size_type> v_idx(no_of_vertices);
  int node_cnt = 0;  // index of current vertex: lexicographic numbering
  for (size_type j = 0; j <= ny; ++j) {
    for (size_type i = 0; i <= nx; ++i, ++node_cnt) {
      // Tensor-product node locations
      coord_t node_coord(2);
      node_coord << bottom_left_corner_[0] + i * hx,
          bottom_left_corner_[1] + j * hy;
      // Diagnostics
      SPDLOG_LOGGER_TRACE(Logger(), "Adding vertex {}: {}", node_cnt,
                          node_coord.transpose());

      // Enlist vertex
      v_idx[node_cnt] = mesh_factory_->AddPoint(node_coord);
    }
  }

  // Initialize edges
  // Just in case of index permutations
  std::vector<size_type> e_idx(no_of_edges);
  int edge_cnt = 0;  // index of current edge
  // First horizontal edges
  for (size_type i = 0; i < nx; ++i) {
    for (size_type j = 0; j <= ny; ++j, ++edge_cnt) {
      // Indices of the two endpoints of the edge
      auto first_endpoint_idx = v_idx[VertexIndex(i, j)];
      auto second_endpoint_idx = v_idx[VertexIndex(i + 1, j)];
      // Diagnostics
      SPDLOG_LOGGER_TRACE(Logger(), "horizontal edge {}: {} <-> {}", edge_cnt,
                          first_endpoint_idx, second_endpoint_idx);

      std::vector<size_type> nodes_index_list{first_endpoint_idx,
                                              second_endpoint_idx};
      // Coordinates of endpoints a columns of a 2x2 matrix
      Eigen::Matrix<double, Eigen::Dynamic, 2> edge_geo(2, 2);
      edge_geo << bottom_left_corner_[0] + i * hx,
          bottom_left_corner_[0] + (i + 1) * hx,
          bottom_left_corner_[1] + j * hy, bottom_left_corner_[1] + j * hy;
      e_idx[edge_cnt] = mesh_factory_->AddEntity(
          lf::base::RefEl::kSegment(), nodes_index_list,
          std::make_unique<geometry::SegmentO1>(edge_geo));
    }
  }
  // Next vertical edges
  for (size_type i = 0; i <= nx; ++i) {
    for (size_type j = 0; j < ny; ++j, ++edge_cnt) {
      // Indices of the two endpoints of the edge
      const size_type first_endpoint_idx = v_idx[VertexIndex(i, j)];
      const size_type second_endpoint_idx = v_idx[VertexIndex(i, j + 1)];
      // Diagnostics
      SPDLOG_LOGGER_TRACE(Logger(), "vertical edge {}: {} <-> {}", edge_cnt,
                          first_endpoint_idx, second_endpoint_idx);

      std::vector<size_type> nodes_index_list{first_endpoint_idx,
                                              second_endpoint_idx};
      // Coordinates of endpoints a columns of a 2x2 matrix
      Eigen::Matrix<double, Eigen::Dynamic, 2> edge_geo(2, 2);
      edge_geo << bottom_left_corner_[0] + i * hx,
          bottom_left_corner_[0] + i * hx, bottom_left_corner_[1] + j * hy,
          bottom_left_corner_[1] + (j + 1) * hy;
      e_idx[edge_cnt] = mesh_factory_->AddEntity(
          lf::base::RefEl::kSegment(), nodes_index_list,
          std::make_unique<geometry::SegmentO1>(edge_geo));
    }
  }
  // Then the skew edges (diagonals of squares)
  for (size_type i = 0; i < nx; ++i) {
    for (size_type j = 0; j < ny; ++j, ++edge_cnt) {
      // Indices of the two endpoints of the edge
      const size_type first_endpoint_idx = v_idx[VertexIndex(i, j)];
      const size_type second_endpoint_idx = v_idx[VertexIndex(i + 1, j + 1)];
      // Diagnostics
      SPDLOG_LOGGER_TRACE(Logger(), "diagonal edge {}: {} <-> {}", edge_cnt,
                          first_endpoint_idx, second_endpoint_idx);

      std::vector<size_type> nodes_index_list{first_endpoint_idx,
                                              second_endpoint_idx};
      // Coordinates of endpoints a columns of a 2x2 matrix
      Eigen::Matrix<double, Eigen::Dynamic, 2> edge_geo(2, 2);
      edge_geo << bottom_left_corner_[0] + i * hx,
          bottom_left_corner_[0] + (i + 1) * hx,
          bottom_left_corner_[1] + j * hy,
          bottom_left_corner_[1] + (j + 1) * hy;
      e_idx[edge_cnt] = mesh_factory_->AddEntity(
          lf::base::RefEl::kSegment(), nodes_index_list,
          std::make_unique<geometry::SegmentO1>(edge_geo));
    }
  }

  // Finally initialize the triangles
  // Index remapping for triangles
  std::vector<size_type> t_idx(no_of_cells);

  size_type tria_cnt = 0;  // index of current triangle
  for (size_type i = 0; i < nx; ++i) {
    for (size_type j = 0; j < ny; ++j, tria_cnt += 2) {
      // Triangle above the diagonal
      // Indices of the vertices
      std::vector<size_type> vertex_index_list_up{
          v_idx[VertexIndex(i, j)], v_idx[VertexIndex(i + 1, j + 1)],
          v_idx[VertexIndex(i, j + 1)]};
      // Construct geometry
      Eigen::Matrix<double, Eigen::Dynamic, 3> tria_geo_up(2, 3);
      tria_geo_up << bottom_left_corner_[0] + i * hx,
          bottom_left_corner_[0] + (i + 1) * hx,
          bottom_left_corner_[0] + i * hx, bottom_left_corner_[1] + j * hy,
          bottom_left_corner_[1] + (j + 1) * hy,
          bottom_left_corner_[1] + (j + 1) * hy;
      // Enroll the triangle entity
      t_idx[tria_cnt] = mesh_factory_->AddEntity(
          lf::base::RefEl::kTria(), vertex_index_list_up,
          std::make_unique<geometry::TriaO1>(tria_geo_up));
      // Triangle below the diagonal
      // Indices of the vertices
      std::vector<size_type> vertex_index_list_low{
          v_idx[VertexIndex(i, j)], v_idx[VertexIndex(i + 1, j)],
          v_idx[VertexIndex(i + 1, j + 1)]};
      // Construct geometry
      Eigen::Matrix<double, Eigen::Dynamic, 3> tria_geo_low(2, 3);
      tria_geo_low << bottom_left_corner_[0] + i * hx,
          bottom_left_corner_[0] + (i + 1) * hx,
          bottom_left_corner_[0] + (i + 1) * hx,
          bottom_left_corner_[1] + j * hy, bottom_left_corner_[1] + j * hy,
          bottom_left_corner_[1] + (j + 1) * hy;
      auto tria_geo_low_ptr = std::make_unique<geometry::TriaO1>(tria_geo_low);
      // Generate the triangle entity
      t_idx[tria_cnt + 1] = mesh_factory_->AddEntity(
          lf::base::RefEl::kTria(), vertex_index_list_low,
          std::make_unique<geometry::TriaO1>(tria_geo_low));
    }
  }
  return mesh_factory_->Build();
}